

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void fs_fixup_k(FuncState *fs,GCproto *pt,void *kptr)

{
  uint uVar1;
  GCtab *pGVar2;
  uint64_t uVar3;
  uint *puVar4;
  GCobj *v;
  GCobj *o;
  TValue *tv_1;
  ptrdiff_t kidx;
  Node *n;
  TValue *tv;
  MSize hmask;
  MSize i;
  Node *node;
  TValue *array;
  GCtab *kt;
  void *kptr_local;
  GCproto *pt_local;
  FuncState *fs_local;
  
  if (0x10000 < fs->nkn) {
    err_limit(fs,0x10000,"constants");
  }
  if (fs->nkgc < 0x10001) {
    (pt->k).ptr64 = (uint64_t)kptr;
    pt->sizekn = fs->nkn;
    pt->sizekgc = fs->nkgc;
    pGVar2 = fs->kt;
    uVar3 = (pGVar2->array).ptr64;
    for (tv._4_4_ = 0; tv._4_4_ < pGVar2->asize; tv._4_4_ = tv._4_4_ + 1) {
      if (*(int *)(uVar3 + 4 + (ulong)tv._4_4_ * 8) == 0) {
        *(double *)((long)kptr + (ulong)*(uint *)(uVar3 + (ulong)tv._4_4_ * 8) * 8) =
             (double)tv._4_4_;
      }
    }
    uVar3 = (pGVar2->node).ptr64;
    uVar1 = pGVar2->hmask;
    for (tv._4_4_ = 0; tv._4_4_ <= uVar1; tv._4_4_ = tv._4_4_ + 1) {
      puVar4 = (uint *)(uVar3 + (ulong)tv._4_4_ * 0x18);
      if (puVar4[1] == 0) {
        if ((uint)((long)*(undefined8 *)(puVar4 + 2) >> 0x2f) < 0xfffffff2) {
          *(undefined8 *)((long)kptr + (ulong)*puVar4 * 8) = *(undefined8 *)(puVar4 + 2);
        }
        else {
          v = (GCobj *)(*(ulong *)(puVar4 + 2) & 0x7fffffffffff);
          *(GCobj **)((long)kptr + ((ulong)*puVar4 ^ 0xffffffffffffffff) * 8) = v;
          if ((((v->gch).marked & 3) != 0) && ((pt->marked & 4) != 0)) {
            lj_gc_barrierf((global_State *)(fs->L->glref).ptr64,(GCobj *)pt,v);
          }
          if ((int)((long)*(undefined8 *)(puVar4 + 2) >> 0x2f) == -8) {
            fs_fixup_uv2(fs,&v->pt);
          }
        }
      }
    }
    return;
  }
  err_limit(fs,0x10000,"constants");
}

Assistant:

static void fs_fixup_k(FuncState *fs, GCproto *pt, void *kptr)
{
  GCtab *kt;
  TValue *array;
  Node *node;
  MSize i, hmask;
  checklimitgt(fs, fs->nkn, BCMAX_D+1, "constants");
  checklimitgt(fs, fs->nkgc, BCMAX_D+1, "constants");
  setmref(pt->k, kptr);
  pt->sizekn = fs->nkn;
  pt->sizekgc = fs->nkgc;
  kt = fs->kt;
  array = tvref(kt->array);
  for (i = 0; i < kt->asize; i++)
    if (tvhaskslot(&array[i])) {
      TValue *tv = &((TValue *)kptr)[tvkslot(&array[i])];
      if (LJ_DUALNUM)
	setintV(tv, (int32_t)i);
      else
	setnumV(tv, (lua_Number)i);
    }
  node = noderef(kt->node);
  hmask = kt->hmask;
  for (i = 0; i <= hmask; i++) {
    Node *n = &node[i];
    if (tvhaskslot(&n->val)) {
      ptrdiff_t kidx = (ptrdiff_t)tvkslot(&n->val);
      lj_assertFS(!tvisint(&n->key), "unexpected integer key");
      if (tvisnum(&n->key)) {
	TValue *tv = &((TValue *)kptr)[kidx];
	if (LJ_DUALNUM) {
	  lua_Number nn = numV(&n->key);
	  int32_t k = lj_num2int(nn);
	  lj_assertFS(!tvismzero(&n->key), "unexpected -0 key");
	  if ((lua_Number)k == nn)
	    setintV(tv, k);
	  else
	    *tv = n->key;
	} else {
	  *tv = n->key;
	}
      } else {
	GCobj *o = gcV(&n->key);
	setgcref(((GCRef *)kptr)[~kidx], o);
	lj_gc_objbarrier(fs->L, pt, o);
	if (tvisproto(&n->key))
	  fs_fixup_uv2(fs, gco2pt(o));
      }
    }
  }
}